

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestGeoLocusIntersect.cpp
# Opt level: O0

bool ParseGeoLocusIntersect(string *sLine1,string *sLine2,string *sLine3)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  syntax_option_type __f;
  int iVar4;
  value_type *pvVar5;
  char *pcVar6;
  ostream *poVar7;
  string local_a90;
  double local_a70;
  double dLon;
  double local_a48;
  double dLat;
  undefined1 local_a38 [8];
  string sPtIntLon_1;
  undefined1 local_a10 [8];
  string sPtIntLat_1;
  undefined1 local_9e8 [8];
  string sPtIntLon;
  undefined1 local_9c0 [8];
  string sPtIntLat;
  undefined1 auStack_998 [4];
  int nVal;
  LLPoint intersection;
  string local_968;
  undefined1 local_948 [8];
  LLPoint geoEnd;
  string local_918;
  undefined1 local_8f8 [8];
  LLPoint geoStart;
  string local_8c8;
  string local_8a8;
  string local_888;
  string local_868;
  string local_848;
  string local_828;
  string local_808;
  undefined1 local_7e8 [8];
  Locus locus;
  string local_770;
  undefined1 local_750 [8];
  string sIntersectionLong;
  string sIntersectionLat;
  string sLocusEndDist;
  string sLocusStartDist;
  string sLocusEndLong;
  string sLocusEndLat;
  string sLocusStartLong;
  string sLocusStartLat;
  string sLocusGeoEndLong;
  string sLocusGeoEndLat;
  string sLocusGeoStartLong;
  string sLocusGeoStartLat;
  regex_error *e;
  string_type local_538;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_518;
  string_type local_490;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_470;
  string_type local_3e8;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_3c8;
  string_type local_340;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_320;
  string_type local_298;
  undefined1 local_278 [8];
  sregex_token_iterator s_end;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d8;
  undefined1 local_1d0 [8];
  sregex_token_iterator it;
  int sub_matches [5];
  regex pat;
  undefined1 local_108 [8];
  string sRxPat;
  string local_d0 [4];
  syntax_option_type flags;
  string sGeodesicEndLong;
  string sGeodesicEndLat;
  string sGeodesicStartLong;
  string sGeodesicStartLat;
  string sTestId;
  bool bPassed;
  string *sLine3_local;
  string *sLine2_local;
  string *sLine1_local;
  
  sTestId.field_2._M_local_buf[0xf] = '\x01';
  trim(sLine1," \t\n\r\f\v");
  std::__cxx11::string::string((string *)(sGeodesicStartLat.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sGeodesicStartLong.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sGeodesicEndLat.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sGeodesicEndLong.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_d0);
  __f = std::regex_constants::operator|(1,0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_108,"([a-zA-Z]*\\d*)[,]",
             (allocator *)
             ((long)&pat._M_automaton.
                     super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pat._M_automaton.
                     super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  std::__cxx11::string::operator+=((string *)local_108,"[A-z ]+[,]");
  std::__cxx11::string::operator+=
            ((string *)local_108,
             "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]")
  ;
  std::__cxx11::string::operator+=
            ((string *)local_108,
             "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]")
  ;
  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
  basic_regex<std::char_traits<char>,std::allocator<char>>
            ((basic_regex<char,std::__cxx11::regex_traits<char>> *)(sub_matches + 4),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,__f);
  it._M_has_m1 = true;
  it._129_7_ = 0x2000000;
  sub_matches[0] = 3;
  sub_matches[1] = 4;
  sub_matches[2] = 5;
  local_1e0._M_current = (char *)std::__cxx11::string::begin();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_1d8,&local_1e0);
  s_end._128_8_ = std::__cxx11::string::end();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_1e8,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&s_end._M_has_m1);
  std::__cxx11::
  regex_token_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char,std::__cxx11::regex_traits<char>>
  ::regex_token_iterator<5ul>
            ((regex_token_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char,std::__cxx11::regex_traits<char>>
              *)local_1d0,local_1d8,local_1e8,(regex_type *)(sub_matches + 4),
             (int (*) [5])&it._M_has_m1,0);
  std::__cxx11::
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  ::regex_token_iterator
            ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
              *)local_278);
  bVar3 = std::__cxx11::
          regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
          ::operator!=((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                        *)local_1d0,
                       (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                        *)local_278);
  if (bVar3) {
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_320,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_1d0,0);
    pvVar5 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_320);
    std::__cxx11::sub_match::operator_cast_to_string(&local_298,(sub_match *)pvVar5);
    std::__cxx11::string::operator=
              ((string *)(sGeodesicStartLat.field_2._M_local_buf + 8),(string *)&local_298);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_320);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_3c8,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_1d0,0);
    pvVar5 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_3c8);
    std::__cxx11::sub_match::operator_cast_to_string(&local_340,(sub_match *)pvVar5);
    std::__cxx11::string::operator=
              ((string *)(sGeodesicStartLong.field_2._M_local_buf + 8),(string *)&local_340);
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_3c8);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_470,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_1d0,0);
    pvVar5 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_470);
    std::__cxx11::sub_match::operator_cast_to_string(&local_3e8,(sub_match *)pvVar5);
    std::__cxx11::string::operator=
              ((string *)(sGeodesicEndLat.field_2._M_local_buf + 8),(string *)&local_3e8);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_470);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_518,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_1d0,0);
    pvVar5 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_518);
    std::__cxx11::sub_match::operator_cast_to_string(&local_490,(sub_match *)pvVar5);
    std::__cxx11::string::operator=
              ((string *)(sGeodesicEndLong.field_2._M_local_buf + 8),(string *)&local_490);
    std::__cxx11::string::~string((string *)&local_490);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_518);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&e,(regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                        *)local_1d0,0);
    pvVar5 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                          *)&e);
    std::__cxx11::sub_match::operator_cast_to_string(&local_538,(sub_match *)pvVar5);
    std::__cxx11::string::operator=(local_d0,(string *)&local_538);
    std::__cxx11::string::~string((string *)&local_538);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator
              ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                *)&e);
  }
  std::__cxx11::
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  ::~regex_token_iterator
            ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
              *)local_278);
  std::__cxx11::
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  ::~regex_token_iterator
            ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
              *)local_1d0);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)(sub_matches + 4));
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::string((string *)(sLocusGeoStartLong.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sLocusGeoEndLat.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sLocusGeoEndLong.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sLocusStartLat.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sLocusStartLong.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sLocusEndLat.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sLocusEndLong.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sLocusStartDist.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sLocusEndDist.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sIntersectionLat.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sIntersectionLong.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_750);
  std::__cxx11::string::string((string *)&local_770,(string *)sLine2);
  bVar3 = ParseGeoLocusIntersect2
                    (&local_770,(string *)((long)&sLocusGeoStartLong.field_2 + 8),
                     (string *)((long)&sLocusGeoEndLat.field_2 + 8),
                     (string *)((long)&sLocusGeoEndLong.field_2 + 8),
                     (string *)((long)&sLocusStartLat.field_2 + 8),
                     (string *)((long)&sLocusStartLong.field_2 + 8),
                     (string *)((long)&sLocusEndLat.field_2 + 8),
                     (string *)((long)&sLocusEndLong.field_2 + 8),
                     (string *)((long)&sLocusStartDist.field_2 + 8),
                     (string *)((long)&sLocusEndDist.field_2 + 8),
                     (string *)((long)&sIntersectionLat.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_770);
  if (((bVar3 ^ 0xffU) & 1) == 0) {
    std::__cxx11::string::string((string *)&locus.lineType,(string *)sLine3);
    bVar3 = ParseGeoLocusIntersect3
                      ((string *)&locus.lineType,(string *)((long)&sIntersectionLong.field_2 + 8),
                       (string *)local_750);
    std::__cxx11::string::~string((string *)&locus.lineType);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      GeoCalcs::LOCUS::LOCUS((LOCUS *)local_7e8);
      std::__cxx11::string::string
                ((string *)&local_808,(string *)(sLocusGeoStartLong.field_2._M_local_buf + 8));
      dVar1 = ParseLatitude(&local_808);
      dVar1 = Deg2Rad(dVar1);
      std::__cxx11::string::string
                ((string *)&local_828,(string *)(sLocusGeoEndLat.field_2._M_local_buf + 8));
      dVar2 = ParseLongitude(&local_828);
      dVar2 = Deg2Rad(dVar2);
      GeoCalcs::LLPOINT::Set((LLPOINT *)local_7e8,dVar1,dVar2);
      std::__cxx11::string::~string((string *)&local_828);
      std::__cxx11::string::~string((string *)&local_808);
      std::__cxx11::string::string
                ((string *)&local_848,(string *)(sLocusGeoEndLong.field_2._M_local_buf + 8));
      dVar1 = ParseLatitude(&local_848);
      dVar1 = Deg2Rad(dVar1);
      std::__cxx11::string::string
                ((string *)&local_868,(string *)(sLocusStartLat.field_2._M_local_buf + 8));
      dVar2 = ParseLongitude(&local_868);
      dVar2 = Deg2Rad(dVar2);
      GeoCalcs::LLPOINT::Set((LLPOINT *)&locus.geoStart.longitude,dVar1,dVar2);
      std::__cxx11::string::~string((string *)&local_868);
      std::__cxx11::string::~string((string *)&local_848);
      std::__cxx11::string::string
                ((string *)&local_888,(string *)(sLocusStartLong.field_2._M_local_buf + 8));
      dVar1 = ParseLatitude(&local_888);
      dVar1 = Deg2Rad(dVar1);
      std::__cxx11::string::string
                ((string *)&local_8a8,(string *)(sLocusEndLat.field_2._M_local_buf + 8));
      dVar2 = ParseLongitude(&local_8a8);
      dVar2 = Deg2Rad(dVar2);
      GeoCalcs::LLPOINT::Set((LLPOINT *)&locus.geoEnd.longitude,dVar1,dVar2);
      std::__cxx11::string::~string((string *)&local_8a8);
      std::__cxx11::string::~string((string *)&local_888);
      std::__cxx11::string::string
                ((string *)&local_8c8,(string *)(sLocusEndLong.field_2._M_local_buf + 8));
      dVar1 = ParseLatitude(&local_8c8);
      dVar1 = Deg2Rad(dVar1);
      std::__cxx11::string::string
                ((string *)&geoStart.longitude,(string *)(sLocusStartDist.field_2._M_local_buf + 8))
      ;
      dVar2 = ParseLongitude((string *)&geoStart.longitude);
      dVar2 = Deg2Rad(dVar2);
      GeoCalcs::LLPOINT::Set((LLPOINT *)&locus.locusStart.longitude,dVar1,dVar2);
      std::__cxx11::string::~string((string *)&geoStart.longitude);
      std::__cxx11::string::~string((string *)&local_8c8);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      dVar1 = atof(pcVar6);
      locus.locusEnd.longitude = NmToMeters(dVar1);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      dVar1 = atof(pcVar6);
      locus.startDist = NmToMeters(dVar1);
      std::__cxx11::string::string
                ((string *)&local_918,(string *)(sGeodesicStartLong.field_2._M_local_buf + 8));
      dVar1 = ParseLatitude(&local_918);
      dVar1 = Deg2Rad(dVar1);
      std::__cxx11::string::string
                ((string *)&geoEnd.longitude,(string *)(sGeodesicEndLat.field_2._M_local_buf + 8));
      dVar2 = ParseLongitude((string *)&geoEnd.longitude);
      dVar2 = Deg2Rad(dVar2);
      GeoCalcs::LLPOINT::LLPOINT((LLPOINT *)local_8f8,dVar1,dVar2);
      std::__cxx11::string::~string((string *)&geoEnd.longitude);
      std::__cxx11::string::~string((string *)&local_918);
      std::__cxx11::string::string
                ((string *)&local_968,(string *)(sGeodesicEndLong.field_2._M_local_buf + 8));
      dVar1 = ParseLatitude(&local_968);
      dVar1 = Deg2Rad(dVar1);
      std::__cxx11::string::string((string *)&intersection.longitude,local_d0);
      dVar2 = ParseLongitude((string *)&intersection.longitude);
      dVar2 = Deg2Rad(dVar2);
      GeoCalcs::LLPOINT::LLPOINT((LLPOINT *)local_948,dVar1,dVar2);
      std::__cxx11::string::~string((string *)&intersection.longitude);
      std::__cxx11::string::~string((string *)&local_968);
      GeoCalcs::LLPOINT::LLPOINT((LLPOINT *)auStack_998);
      sPtIntLat.field_2._12_4_ =
           GeoCalcs::GeoLocusIntersect
                     ((LLPoint *)local_8f8,(LLPoint *)local_948,(Locus *)local_7e8,
                      (LLPoint *)auStack_998,1e-09,5e-16);
      if (sPtIntLat.field_2._12_4_ == 0) {
        iVar4 = std::__cxx11::string::compare(sIntersectionLong.field_2._M_local_buf + 8);
        if (iVar4 != 0) {
          sPtIntLon.field_2._8_8_ = Rad2Deg(_auStack_998);
          ConvertLatitudeDdToDms_abi_cxx11_
                    ((string *)local_9c0,(double *)((long)&sPtIntLon.field_2 + 8));
          sPtIntLat_1.field_2._8_8_ = Rad2Deg(intersection.latitude);
          ConvertLongitudeDdToDms_abi_cxx11_
                    ((string *)local_9e8,(double *)((long)&sPtIntLat_1.field_2 + 8));
          poVar7 = std::operator<<((ostream *)&std::cout,"\n");
          poVar7 = std::operator<<(poVar7,(string *)(sGeodesicStartLat.field_2._M_local_buf + 8));
          poVar7 = std::operator<<(poVar7,
                                   "failed: Expected no solution. Calced a solution of Latitude");
          poVar7 = std::operator<<(poVar7,(string *)local_9c0);
          poVar7 = std::operator<<(poVar7," and Longitude ");
          std::operator<<(poVar7,(string *)local_9e8);
          std::__cxx11::string::~string((string *)local_9e8);
          std::__cxx11::string::~string((string *)local_9c0);
        }
        sTestId.field_2._M_local_buf[0xf] = iVar4 == 0;
      }
      else {
        sPtIntLon_1.field_2._8_8_ = Rad2Deg(_auStack_998);
        ConvertLatitudeDdToDms_abi_cxx11_
                  ((string *)local_a10,(double *)((long)&sPtIntLon_1.field_2 + 8));
        dLat = Rad2Deg(intersection.latitude);
        ConvertLongitudeDdToDms_abi_cxx11_((string *)local_a38,&dLat);
        iVar4 = std::__cxx11::string::compare((string *)local_a10);
        if (iVar4 != 0) {
          std::__cxx11::string::string
                    ((string *)&dLon,(string *)(sIntersectionLong.field_2._M_local_buf + 8));
          dVar1 = ParseLatitude((string *)&dLon);
          dVar1 = Deg2Rad(dVar1);
          std::__cxx11::string::~string((string *)&dLon);
          local_a48 = dVar1;
          sTestId.field_2._M_local_buf[0xf] = IsApprox(dVar1,_auStack_998,1e-10);
          if ((bool)sTestId.field_2._M_local_buf[0xf]) {
            poVar7 = std::operator<<((ostream *)&std::cout,"\n");
            poVar7 = std::operator<<(poVar7,(string *)(sGeodesicStartLat.field_2._M_local_buf + 8));
            poVar7 = std::operator<<(poVar7,
                                     " within rounding tolerance of 1e-10: Intersect Latitude: ");
            poVar7 = std::operator<<(poVar7,(string *)(sIntersectionLong.field_2._M_local_buf + 8));
            poVar7 = std::operator<<(poVar7," calced: ");
            std::operator<<(poVar7,(string *)local_a10);
          }
          else {
            poVar7 = std::operator<<((ostream *)&std::cout,"\n");
            poVar7 = std::operator<<(poVar7,(string *)(sGeodesicStartLat.field_2._M_local_buf + 8));
            poVar7 = std::operator<<(poVar7," failed: Expected Intersect latitude: ");
            poVar7 = std::operator<<(poVar7,(string *)(sIntersectionLong.field_2._M_local_buf + 8));
            poVar7 = std::operator<<(poVar7,"  calced: ");
            std::operator<<(poVar7,(string *)local_a10);
          }
        }
        iVar4 = std::__cxx11::string::compare((string *)local_a38);
        if (iVar4 != 0) {
          std::__cxx11::string::string((string *)&local_a90,(string *)local_750);
          dVar1 = ParseLongitude(&local_a90);
          dVar1 = Deg2Rad(dVar1);
          std::__cxx11::string::~string((string *)&local_a90);
          local_a70 = dVar1;
          bVar3 = IsApprox(dVar1,intersection.latitude,1e-10);
          if (bVar3) {
            poVar7 = std::operator<<((ostream *)&std::cout,"\n");
            poVar7 = std::operator<<(poVar7,(string *)(sGeodesicStartLat.field_2._M_local_buf + 8));
            poVar7 = std::operator<<(poVar7,
                                     " within rounding tolerance of 1e-10: Intersect Longitude: ");
            poVar7 = std::operator<<(poVar7,(string *)local_750);
            poVar7 = std::operator<<(poVar7," calced: ");
            std::operator<<(poVar7,(string *)local_a38);
          }
          else {
            poVar7 = std::operator<<((ostream *)&std::cout,"\n");
            poVar7 = std::operator<<(poVar7,(string *)(sGeodesicStartLat.field_2._M_local_buf + 8));
            poVar7 = std::operator<<(poVar7," failed: Expected Intersect longitude: ");
            poVar7 = std::operator<<(poVar7,(string *)local_750);
            poVar7 = std::operator<<(poVar7,"  calced: ");
            std::operator<<(poVar7,(string *)local_a38);
            sTestId.field_2._M_local_buf[0xf] = '\0';
          }
        }
        std::__cxx11::string::~string((string *)local_a38);
        std::__cxx11::string::~string((string *)local_a10);
      }
    }
    else {
      sTestId.field_2._M_local_buf[0xf] = '\0';
    }
  }
  else {
    sTestId.field_2._M_local_buf[0xf] = '\0';
  }
  std::__cxx11::string::~string((string *)local_750);
  std::__cxx11::string::~string((string *)(sIntersectionLong.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sIntersectionLat.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sLocusEndDist.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sLocusStartDist.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sLocusEndLong.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sLocusEndLat.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sLocusStartLong.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sLocusStartLat.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sLocusGeoEndLong.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sLocusGeoEndLat.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sLocusGeoStartLong.field_2._M_local_buf + 8));
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string((string *)(sGeodesicEndLong.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sGeodesicEndLat.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sGeodesicStartLong.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sGeodesicStartLat.field_2._M_local_buf + 8));
  return (bool)sTestId.field_2._M_local_buf[0xf];
}

Assistant:

bool ParseGeoLocusIntersect(string sLine1, string sLine2, string sLine3)
{
    bool bPassed = true;
    trim(sLine1);
    string sTestId, sGeodesicStartLat, sGeodesicStartLong, sGeodesicEndLat, sGeodesicEndLong;
    try
    {
        regex_constants::syntax_option_type flags = regex_constants::icase | regex_constants::ECMAScript;

        string sRxPat = "([a-zA-Z]*\\d*)[,]";
        sRxPat += "[A-z ]+[,]";
        sRxPat += "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]";
        sRxPat += "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]";
        regex pat(sRxPat, flags);
        int sub_matches[] = {1, 2, 3, 4, 5,};
        sregex_token_iterator it(sLine1.begin(), sLine1.end(), pat, sub_matches);
        sregex_token_iterator s_end;
        if (it != s_end)
        {
            sTestId = *it++;
            sGeodesicStartLat = *it++;
            sGeodesicStartLong = *it++;
            sGeodesicEndLat = *it++;
            sGeodesicEndLong = *it++;
        }
    }
    catch (regex_error &e)
    {
        cout << "\n" << e.what();
        return false;
    }
    string sLocusGeoStartLat, sLocusGeoStartLong, sLocusGeoEndLat, sLocusGeoEndLong;
    string sLocusStartLat, sLocusStartLong, sLocusEndLat, sLocusEndLong;
    string sLocusStartDist, sLocusEndDist, sIntersectionLat, sIntersectionLong;

    if (!ParseGeoLocusIntersect2(sLine2, sLocusGeoStartLat, sLocusGeoStartLong, sLocusGeoEndLat, sLocusGeoEndLong,
                                 sLocusStartLat, sLocusStartLong, sLocusEndLat, sLocusEndLong, sLocusStartDist,
                                 sLocusEndDist))
        bPassed = false;
    else
    {
        if (!ParseGeoLocusIntersect3(sLine3, sIntersectionLat, sIntersectionLong))
            bPassed = false;
        else
        {
            Locus locus;
            locus.geoStart.Set(Deg2Rad(ParseLatitude(sLocusGeoStartLat)), Deg2Rad(ParseLongitude(sLocusGeoStartLong)));
            locus.geoEnd.Set(Deg2Rad(ParseLatitude(sLocusGeoEndLat)), Deg2Rad(ParseLongitude(sLocusGeoEndLong)));
            locus.locusStart.Set(Deg2Rad(ParseLatitude(sLocusStartLat)), Deg2Rad(ParseLongitude(sLocusStartLong)));
            locus.locusEnd.Set(Deg2Rad(ParseLatitude(sLocusEndLat)), Deg2Rad(ParseLongitude(sLocusEndLong)));
            locus.startDist = NmToMeters(atof(sLocusStartDist.c_str()));
            locus.endDist = NmToMeters(atof(sLocusEndDist.c_str()));

            LLPoint geoStart(Deg2Rad(ParseLatitude(sGeodesicStartLat)), Deg2Rad(ParseLongitude(sGeodesicStartLong)));
            LLPoint geoEnd(Deg2Rad(ParseLatitude(sGeodesicEndLat)), Deg2Rad(ParseLongitude(sGeodesicEndLong)));

            LLPoint intersection;
            int nVal = GeoLocusIntersect(geoStart, geoEnd, locus, intersection, kTol, kEps);
            if (nVal == 0)
            {
                if (sIntersectionLat.compare("N/A") != 0)
                {
                    string sPtIntLat = ConvertLatitudeDdToDms(Rad2Deg(intersection.latitude));
                    string sPtIntLon = ConvertLongitudeDdToDms(Rad2Deg(intersection.longitude));
                    cout << "\n" << sTestId << "failed: Expected no solution. Calced a solution of Latitude" <<
                    sPtIntLat << " and Longitude " << sPtIntLon;
                    bPassed = false;
                }
            }
            else
            {
                string sPtIntLat = ConvertLatitudeDdToDms(Rad2Deg(intersection.latitude));
                string sPtIntLon = ConvertLongitudeDdToDms(Rad2Deg(intersection.longitude));
                if (sPtIntLat.compare(sIntersectionLat) != 0)
                {
                    double dLat = Deg2Rad(ParseLatitude(sIntersectionLat));
                    if (IsApprox(dLat, intersection.latitude, 1e-10))
                        cout << "\n" << sTestId << " within rounding tolerance of 1e-10: Intersect Latitude: " <<
                        sIntersectionLat << " calced: " << sPtIntLat;
                    else
                    {
                        cout << "\n" << sTestId << " failed: Expected Intersect latitude: " << sIntersectionLat <<
                        "  calced: " << sPtIntLat;
                        bPassed = false;
                    }
                }
                if (sPtIntLon.compare(sIntersectionLong) != 0)
                {
                    double dLon = Deg2Rad(ParseLongitude(sIntersectionLong));
                    if (IsApprox(dLon, intersection.longitude, 1e-10))
                        cout << "\n" << sTestId << " within rounding tolerance of 1e-10: Intersect Longitude: " <<
                        sIntersectionLong << " calced: " << sPtIntLon;
                    else
                    {
                        cout << "\n" << sTestId << " failed: Expected Intersect longitude: " << sIntersectionLong <<
                        "  calced: " << sPtIntLon;
                        bPassed = false;
                    }
                }

            }
        }
    }
    return bPassed;
}